

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O1

void uv__work_done(uv_async_t *handle)

{
  uv__queue **ppuVar1;
  code *pcVar2;
  uv__queue *puVar3;
  uv_handle_t *puVar4;
  undefined8 uVar5;
  uint uVar6;
  uv__queue local_38;
  
  uv_mutex_lock((uv_mutex_t *)&handle[-1].flags);
  ppuVar1 = &handle[-1].handle_queue.prev;
  puVar3 = handle[-1].handle_queue.prev;
  local_38.next = &local_38;
  if (puVar3 != (uv__queue *)ppuVar1) {
    local_38.prev = (uv__queue *)handle[-1].next_closing;
    ((uv_handle_t *)local_38.prev)->data = &local_38;
    puVar4 = (uv_handle_t *)puVar3->prev;
    handle[-1].next_closing = puVar4;
    puVar4->data = ppuVar1;
    local_38.next = puVar3;
  }
  (local_38.next)->prev = &local_38;
  uv_mutex_unlock((uv_mutex_t *)&handle[-1].flags);
  uVar6 = 0;
  if (local_38.next != &local_38) {
    do {
      (local_38.next)->prev->next = (local_38.next)->next;
      (local_38.next)->next->prev = (local_38.next)->prev;
      uVar5 = 0;
      if (local_38.next[-2].prev == (uv__queue *)uv__cancelled) {
        uVar5 = 0xffffff83;
      }
      (*(code *)local_38.next[-1].next)(&local_38.next[-2].prev,uVar5);
      uVar6 = uVar6 + 1;
    } while (local_38.next != &local_38);
  }
  if (1 < uVar6) {
    *(ulong *)(handle[-2].close_cb + 0x10) =
         *(long *)(handle[-2].close_cb + 0x10) + (ulong)(uVar6 - 1);
    if (*(int *)(handle[-2].close_cb + 0xc0) == 0) {
      pcVar2 = handle[-2].close_cb + 0x18;
      *(ulong *)pcVar2 = *(long *)pcVar2 + (ulong)(uVar6 - 1);
    }
  }
  return;
}

Assistant:

void uv__work_done(uv_async_t* handle) {
  struct uv__work* w;
  uv_loop_t* loop;
  struct uv__queue* q;
  struct uv__queue wq;
  int err;
  int nevents;

  loop = container_of(handle, uv_loop_t, wq_async);
  uv_mutex_lock(&loop->wq_mutex);
  uv__queue_move(&loop->wq, &wq);
  uv_mutex_unlock(&loop->wq_mutex);

  nevents = 0;

  while (!uv__queue_empty(&wq)) {
    q = uv__queue_head(&wq);
    uv__queue_remove(q);

    w = container_of(q, struct uv__work, wq);
    err = (w->work == uv__cancelled) ? UV_ECANCELED : 0;
    w->done(w, err);
    nevents++;
  }

  /* This check accomplishes 2 things:
   * 1. Even if the queue was empty, the call to uv__work_done() should count
   *    as an event. Which will have been added by the event loop when
   *    calling this callback.
   * 2. Prevents accidental wrap around in case nevents == 0 events == 0.
   */
  if (nevents > 1) {
    /* Subtract 1 to counter the call to uv__work_done(). */
    uv__metrics_inc_events(loop, nevents - 1);
    if (uv__get_internal_fields(loop)->current_timeout == 0)
      uv__metrics_inc_events_waiting(loop, nevents - 1);
  }
}